

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

void __thiscall Catch::ConsoleReporter::benchmarkStarting(ConsoleReporter *this,BenchmarkInfo *info)

{
  TablePrinter *pTVar1;
  int iVar2;
  Duration local_30;
  
  pTVar1 = (this->m_tablePrinter)._M_t.
           super___uniq_ptr_impl<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>.
           _M_t.
           super__Tuple_impl<0UL,_Catch::TablePrinter_*,_std::default_delete<Catch::TablePrinter>_>.
           super__Head_base<0UL,_Catch::TablePrinter_*,_false>._M_head_impl;
  std::ostream::operator<<(&pTVar1->m_oss,info->samples);
  Catch::operator<<(pTVar1);
  std::ostream::operator<<(&pTVar1->m_oss,info->iterations);
  Catch::operator<<(pTVar1);
  iVar2 = (*(((this->super_StreamingReporterBase<Catch::ConsoleReporter>).m_config.
              super___shared_ptr<const_Catch::IConfig,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
            super_NonCopyable)._vptr_NonCopyable[0x15])();
  if ((char)iVar2 == '\0') {
    pTVar1 = (this->m_tablePrinter)._M_t.
             super___uniq_ptr_impl<Catch::TablePrinter,_std::default_delete<Catch::TablePrinter>_>.
             _M_t.
             super__Tuple_impl<0UL,_Catch::TablePrinter_*,_std::default_delete<Catch::TablePrinter>_>
             .super__Head_base<0UL,_Catch::TablePrinter_*,_false>._M_head_impl;
    local_30.m_inNanoseconds = info->estimatedDuration;
    local_30.m_units = Nanoseconds;
    if (((1000.0 <= local_30.m_inNanoseconds) &&
        (local_30.m_units = Microseconds, 1000000.0 <= local_30.m_inNanoseconds)) &&
       (local_30.m_units = Milliseconds, 1000000000.0 <= local_30.m_inNanoseconds)) {
      local_30.m_units = local_30.m_inNanoseconds < 60000000000.0 ^ Minutes;
    }
    Catch::operator<<(pTVar1,&local_30);
    Catch::operator<<(pTVar1);
  }
  return;
}

Assistant:

void ConsoleReporter::benchmarkStarting(BenchmarkInfo const& info) {
    (*m_tablePrinter) << info.samples << ColumnBreak()
        << info.iterations << ColumnBreak();
    if (!m_config->benchmarkNoAnalysis())
        (*m_tablePrinter) << Duration(info.estimatedDuration) << ColumnBreak();
}